

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfCompressor.cpp
# Opt level: O0

Compressor * Imf_3_3::newCompressor(Compression c,size_t maxScanLineSize,Header *hdr)

{
  exr_storage_t eVar1;
  undefined4 in_EDI;
  Compressor *ret;
  AcCompression in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff7c;
  size_t in_stack_ffffffffffffff80;
  Header *in_stack_ffffffffffffff88;
  RleCompressor *in_stack_ffffffffffffff90;
  Compressor *local_20;
  
  local_20 = (Compressor *)0x0;
  switch(in_EDI) {
  case 1:
    local_20 = (Compressor *)operator_new(0x458);
    RleCompressor::RleCompressor
              (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
    break;
  case 2:
    local_20 = (Compressor *)operator_new(0x458);
    ZipCompressor::ZipCompressor
              ((ZipCompressor *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    break;
  case 3:
    local_20 = (Compressor *)operator_new(0x458);
    ZipCompressor::ZipCompressor
              ((ZipCompressor *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    break;
  case 4:
    local_20 = (Compressor *)operator_new(0x458);
    PizCompressor::PizCompressor
              ((PizCompressor *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    break;
  case 5:
    local_20 = (Compressor *)operator_new(0x458);
    Pxr24Compressor::Pxr24Compressor
              ((Pxr24Compressor *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c);
    break;
  case 6:
    local_20 = (Compressor *)operator_new(0x458);
    B44Compressor::B44Compressor
              ((B44Compressor *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,
               SUB41(in_stack_ffffffffffffff78 >> 0x18,0));
    break;
  case 7:
    local_20 = (Compressor *)operator_new(0x458);
    B44Compressor::B44Compressor
              ((B44Compressor *)local_20,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
               in_stack_ffffffffffffff7c,SUB41(in_stack_ffffffffffffff78 >> 0x18,0));
    break;
  case 8:
    local_20 = (Compressor *)operator_new(0x458);
    DwaCompressor::DwaCompressor
              ((DwaCompressor *)in_stack_ffffffffffffff90,(Header *)local_20,
               in_stack_ffffffffffffff80,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
    break;
  case 9:
    local_20 = (Compressor *)operator_new(0x458);
    DwaCompressor::DwaCompressor
              ((DwaCompressor *)in_stack_ffffffffffffff90,in_stack_ffffffffffffff88,(size_t)local_20
               ,in_stack_ffffffffffffff7c,in_stack_ffffffffffffff78);
  }
  if ((local_20 != (Compressor *)0x0) &&
     (eVar1 = Compressor::storageType(local_20), eVar1 == EXR_STORAGE_LAST_TYPE)) {
    Compressor::setStorageType(local_20,EXR_STORAGE_SCANLINE);
  }
  return local_20;
}

Assistant:

Compressor*
newCompressor (Compression c, size_t maxScanLineSize, const Header& hdr)
{
    Compressor* ret = nullptr;

    // clang-format off
    switch (c)
    {
        case RLE_COMPRESSION:

            ret = new RleCompressor (hdr, maxScanLineSize);
            break;

        case ZIPS_COMPRESSION:

            ret = new ZipCompressor (hdr, maxScanLineSize, 1);
            break;

        case ZIP_COMPRESSION:

            ret = new ZipCompressor (hdr, maxScanLineSize, 16);
            break;

        case PIZ_COMPRESSION:

            ret = new PizCompressor (hdr, maxScanLineSize, 32);
            break;

        case PXR24_COMPRESSION:

            ret = new Pxr24Compressor (hdr, maxScanLineSize, 16);
            break;

        case B44_COMPRESSION:

            ret = new B44Compressor (hdr, maxScanLineSize, 32, false);
            break;

        case B44A_COMPRESSION:

            ret = new B44Compressor (hdr, maxScanLineSize, 32, true);
            break;

        case DWAA_COMPRESSION:

            ret = new DwaCompressor (
                hdr,
                static_cast<int> (maxScanLineSize),
                32,
                DwaCompressor::STATIC_HUFFMAN);
            break;

        case DWAB_COMPRESSION:

            ret = new DwaCompressor (
                hdr,
                static_cast<int> (maxScanLineSize),
                256,
                DwaCompressor::STATIC_HUFFMAN);
            break;

        default: break;
    }
    // clang-format on

    if (ret && ret->storageType () == EXR_STORAGE_LAST_TYPE)
        ret->setStorageType (EXR_STORAGE_SCANLINE);

    return ret;
}